

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_set.cpp
# Opt level: O1

void __thiscall
icu_63::TransliterationRuleSet::TransliterationRuleSet
          (TransliterationRuleSet *this,TransliterationRuleSet *other)

{
  int iVar1;
  UVector *this_00;
  TransliterationRule *other_00;
  code *this_01;
  int index;
  UErrorCode status;
  UParseError p;
  UErrorCode local_7c;
  undefined1 local_78 [72];
  
  this->_vptr_TransliterationRuleSet = (_func_int **)&PTR__TransliterationRuleSet_00475c50;
  this->ruleVector = (UVector *)0x0;
  this->rules = (TransliterationRule **)0x0;
  this->maxContextLength = other->maxContextLength;
  this_01 = (code *)other->index;
  memcpy(this->index,this_01,0x404);
  local_7c = U_ZERO_ERROR;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)this_01);
  if (this_00 == (UVector *)0x0) {
    this_00 = (UVector *)0x0;
  }
  else {
    this_01 = _deleteRule;
    UVector::UVector(this_00,_deleteRule,(UElementsAreEqual *)0x0,&local_7c);
  }
  this->ruleVector = this_00;
  if ((((this_00 != (UVector *)0x0) && (other->ruleVector != (UVector *)0x0)) &&
      (local_7c < U_ILLEGAL_ARGUMENT_ERROR)) &&
     ((iVar1 = other->ruleVector->count, 0 < iVar1 && (local_7c < U_ILLEGAL_ARGUMENT_ERROR)))) {
    index = 0;
    while( true ) {
      this_01 = (code *)UMemory::operator_new((UMemory *)0x88,(size_t)this_01);
      if ((TransliterationRule *)this_01 == (TransliterationRule *)0x0) {
        this_01 = (code *)0x0;
      }
      else {
        other_00 = (TransliterationRule *)UVector::elementAt(other->ruleVector,index);
        TransliterationRule::TransliterationRule((TransliterationRule *)this_01,other_00);
      }
      if ((TransliterationRule *)this_01 == (TransliterationRule *)0x0) break;
      UVector::addElement(this->ruleVector,this_01,&local_7c);
      if (((U_ZERO_ERROR < local_7c) || (index = index + 1, iVar1 <= index)) ||
         (U_ZERO_ERROR < local_7c)) goto LAB_0023548a;
    }
    local_7c = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_0023548a:
  if ((other->rules != (TransliterationRule **)0x0) && (local_7c < U_ILLEGAL_ARGUMENT_ERROR)) {
    (*this->_vptr_TransliterationRuleSet[4])(this,local_78,&local_7c);
  }
  return;
}

Assistant:

TransliterationRuleSet::TransliterationRuleSet(const TransliterationRuleSet& other) :
    UMemory(other),
    ruleVector(0),
    rules(0),
    maxContextLength(other.maxContextLength) {

    int32_t i, len;
    uprv_memcpy(index, other.index, sizeof(index));
    UErrorCode status = U_ZERO_ERROR;
    ruleVector = new UVector(&_deleteRule, NULL, status);
    if (other.ruleVector != 0 && ruleVector != 0 && U_SUCCESS(status)) {
        len = other.ruleVector->size();
        for (i=0; i<len && U_SUCCESS(status); ++i) {
            TransliterationRule *tempTranslitRule = new TransliterationRule(*(TransliterationRule*)other.ruleVector->elementAt(i));
            // Null pointer test
            if (tempTranslitRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            ruleVector->addElement(tempTranslitRule, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
    }
    if (other.rules != 0 && U_SUCCESS(status)) {
        UParseError p;
        freeze(p, status);
    }
}